

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generateFissionYields.hpp
# Opt level: O2

vector<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
* njoy::ENDFtk::section::Type<8,_454>::generateFissionYields
            (vector<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
             *__return_storage_ptr__,
            vector<unsigned_int,_std::allocator<unsigned_int>_> *identifiers,
            vector<unsigned_int,_std::allocator<unsigned_int>_> *states,
            vector<double,_std::allocator<double>_> *energies,
            vector<unsigned_int,_std::allocator<unsigned_int>_> *interpolants,
            vector<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
            *yields)

{
  pointer pvVar1;
  pointer pdVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong local_98;
  fn<meta::id<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>
  local_90 [8];
  vector<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
  *local_88;
  undefined4 local_80;
  undefined1 local_7c;
  _Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  uVar5 = uVar7 & 0xffffffff;
  std::
  vector<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  ::reserve(__return_storage_ptr__,uVar5);
  if (uVar5 != ((long)(interpolants->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(interpolants->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 2) + 1U) {
    tools::Log::error<char_const*>((char *)yields);
    tools::Log::info<char_const*>((char *)yields);
    tools::Log::info<char_const*,unsigned_long>
              ("Number of I values: {}",
               (long)(interpolants->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(interpolants->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 2);
    tools::Log::info<char_const*,unsigned_int>("NE value: {}",(uint)uVar7);
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = getenv;
    __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
  }
  uVar4 = (ulong)((long)(identifiers->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(identifiers->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       )._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff;
  if ((uVar4 == (long)(states->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(states->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 2) &&
     (pvVar1 = (yields->
               super__Vector_base<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     uVar4 == ((long)(yields->
                     super__Vector_base<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18)) {
    lVar8 = 8;
    uVar6 = 0;
    while( true ) {
      if (uVar4 == uVar6) {
        lVar8 = 0;
        for (uVar5 = 0; (uVar7 & 0xffffffff) != uVar5; uVar5 = uVar5 + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,identifiers);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,states);
          local_80 = (undefined4)uVar5;
          local_7c = 1;
          local_88 = yields;
          ranges::detail::to_container::
          fn<meta::id<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>::
          impl<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>*,std::vector<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,std::allocator<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>>,ranges::iter_transform_view<ranges::ref_view<std::vector<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,std::allocator<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>>,ranges::indirected<njoy::ENDFtk::section::Type<8,454>::generateFissionYields(std::vector<unsigned_int,std::allocator<unsigned_int>>&&,std::vector<unsigned_int,std::allocator<unsigned_int>>&&,std::vector<double,std::allocator<double>>&&,std::vector<unsigned_int,std::allocator<unsigned_int>>&&,std::vector<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,std::allocator<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>&&)::_lambda(auto:1_const&)_1_>>::adaptor<false>>>,ranges::transform_view<ranges::ref_view<std::vector<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,std::allocator<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>>,njoy::ENDFtk::section::Type<8,454>::generateFissionYields(std::vector<unsigned_int,std::allocator<unsigned_int>>&&,std::vector<unsigned_int,std::allocator<unsigned_int>>&&,std::vector<double,std::allocator<double>>&&,std::vector<unsigned_int,std::allocator<unsigned_int>>&&,std::vector<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,std::allocator<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>&&)::_lambda(auto:1_const&)_1_>>
                    (&local_78,local_90);
          pdVar2 = (energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (uVar5 == 0) {
            local_98 = ((long)(energies->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) - 1;
          }
          else {
            local_98 = (ulong)(interpolants->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar5 - 1];
          }
          std::
          vector<njoy::ENDFtk::section::FissionYieldData,std::allocator<njoy::ENDFtk::section::FissionYieldData>>
          ::
          emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,double&,unsigned_long>
                    ((vector<njoy::ENDFtk::section::FissionYieldData,std::allocator<njoy::ENDFtk::section::FissionYieldData>>
                      *)__return_storage_ptr__,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
                     (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     &local_78,(double *)((long)pdVar2 + lVar8),&local_98);
          std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
          ~_Vector_base(&local_78);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
          lVar8 = lVar8 + 8;
        }
        return __return_storage_ptr__;
      }
      if (*(long *)((long)&(pvVar1->
                           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                           )._M_impl.super__Vector_impl_data + lVar8) -
          *(long *)((long)pvVar1 + lVar8 + -8) >> 4 != uVar5) break;
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x18;
    }
    tools::Log::error<char_const*,unsigned_int>
              ("The number of fission yield values for the fission product with index {} is not equal to the expected value"
               ,(uint)uVar6);
    tools::Log::info<char_const*,unsigned_int>("NE value: {}",(uint)uVar7);
    pvVar1 = (yields->
             super__Vector_base<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    tools::Log::info<char_const*,unsigned_long>
              ("yields[i].size(): {}",
               *(long *)((long)&(pvVar1->
                                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                )._M_impl.super__Vector_impl_data + lVar8) -
               *(long *)((long)pvVar1 + lVar8 + -8) >> 4);
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = getenv;
    __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
  }
  tools::Log::error<char_const*>((char *)yields);
  tools::Log::info<char_const*>((char *)yields);
  tools::Log::info<char_const*,unsigned_long>
            ("Number of identifiers: {}",
             (long)(identifiers->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(identifiers->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2);
  tools::Log::info<char_const*,unsigned_long>
            ("Number of isomeric states: {}",
             (long)(states->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(states->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  tools::Log::info<char_const*,unsigned_long>
            ("Number of yield sets: {}",
             ((long)(yields->
                    super__Vector_base<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(yields->
                   super__Vector_base<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = getenv;
  __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< FissionYieldData >
generateFissionYields( std::vector< unsigned int >&& identifiers,
                       std::vector< unsigned int >&& states,
                       std::vector< double >&& energies,
                       std::vector< unsigned int >&& interpolants,
                       std::vector< std::vector< std::array< double, 2 > > >&& yields ) {

  std::vector< FissionYieldData > sequence;
  unsigned int size = energies.size();
  sequence.reserve( size );

  if ( size != interpolants.size() + 1 ) {

    Log::error( "Encountered inconsistent number of energy values and "
                "interpolation flags" );
    Log::info( "Number of I values must be equal to NE - 1" );
    Log::info( "Number of I values: {}", interpolants.size() );
    Log::info( "NE value: {}", size );
    throw std::exception();
  }

  unsigned int nfp = identifiers.size();
  if ( ( nfp != states.size() ) || ( nfp != yields.size() ) ) {

    Log::error( "Encountered inconsistent number of identifiers, isomeric states "
                "and yield data" );
    Log::info( "Number of identifiers, isomeric states and yield sets must be the same" );
    Log::info( "Number of identifiers: {}", identifiers.size() );
    Log::info( "Number of isomeric states: {}", states.size() );
    Log::info( "Number of yield sets: {}", yields.size() );
    throw std::exception();
  }

  for ( unsigned int i = 0; i < nfp; ++i ) {

    if ( yields[i].size() != size ) {

      Log::error( "The number of fission yield values for the fission product "
                 "with index {} is not equal to the expected value", i );
      Log::info( "NE value: {}", size );
      Log::info( "yields[i].size(): {}", yields[i].size() );
      throw std::exception();
    }
  }

  for ( unsigned int i = 0; i < size; ++i ) {

    sequence.emplace_back( std::vector< unsigned int >( identifiers ),
                           std::vector< unsigned int >( states ),
                           ranges::to< std::vector< std::array< double, 2 > > >(
                               yields | ranges::cpp20::views::transform(
                                            [i] ( const auto& range )
                                                { return range[i]; } ) ),
                           energies[i],
                           i == 0 ? energies.size() - 1 : interpolants[i-1] );
  }

  return sequence;
}